

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void __thiscall
duckdb::BitpackingScanState<unsigned_int,_int>::LoadNextGroup
          (BitpackingScanState<unsigned_int,_int> *this)

{
  uint *puVar1;
  BitpackingMode BVar2;
  uint uVar3;
  uint *puVar4;
  InternalException *pIVar5;
  string local_40;
  
  this->current_group_offset = 0;
  puVar4 = (uint *)this->bitpacking_metadata_ptr;
  uVar3 = *puVar4;
  this->current_group =
       (bitpacking_metadata_t)
       ((ulong)(uVar3 & 0xffffff) << 0x20 | (ulong)*(byte *)((long)puVar4 + 3));
  this->bitpacking_metadata_ptr = (data_ptr_t)(puVar4 + -1);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  puVar4 = (uint *)(((this->handle).node.ptr)->buffer +
                   (ulong)(uVar3 & 0xffffff) + this->current_segment->offset);
  this->current_group_ptr = (data_ptr_t)puVar4;
  BVar2 = (this->current_group).mode;
  if (BVar2 - 3 < 3) {
    this->current_frame_of_reference = *puVar4;
  }
  else {
    if (BVar2 != CONSTANT) {
      pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Invalid bitpacking mode","");
      InternalException::InternalException(pIVar5,&local_40);
      __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this->current_constant = *puVar4;
  }
  puVar1 = puVar4 + 1;
  this->current_group_ptr = (data_ptr_t)puVar1;
  if (BVar2 - 4 < 2) {
    this->current_width = (data_t)*puVar1;
  }
  else {
    if (BVar2 == CONSTANT) {
      return;
    }
    if (BVar2 != CONSTANT_DELTA) {
      pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Invalid bitpacking mode","");
      InternalException::InternalException(pIVar5,&local_40);
      __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this->current_constant = *puVar1;
  }
  this->current_group_ptr = (data_ptr_t)(puVar4 + 2);
  if (BVar2 == DELTA_FOR) {
    this->current_delta_offset = *(uint *)this->current_group_ptr;
    this->current_group_ptr = (data_ptr_t)((long)this->current_group_ptr + 4);
  }
  return;
}

Assistant:

void LoadNextGroup() {
		D_ASSERT(bitpacking_metadata_ptr > handle.Ptr() &&
		         (bitpacking_metadata_ptr < handle.Ptr() + current_segment.GetBlockManager().GetBlockSize()));
		current_group_offset = 0;
		current_group = DecodeMeta(reinterpret_cast<bitpacking_metadata_encoded_t *>(bitpacking_metadata_ptr));

		bitpacking_metadata_ptr -= sizeof(bitpacking_metadata_encoded_t);
		current_group_ptr = GetPtr(current_group);

		// Read first value
		switch (current_group.mode) {
		case BitpackingMode::CONSTANT:
			current_constant = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		case BitpackingMode::FOR:
		case BitpackingMode::CONSTANT_DELTA:
		case BitpackingMode::DELTA_FOR:
			current_frame_of_reference = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		default:
			throw InternalException("Invalid bitpacking mode");
		}

		// Read second value
		switch (current_group.mode) {
		case BitpackingMode::CONSTANT_DELTA:
			current_constant = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		case BitpackingMode::FOR:
		case BitpackingMode::DELTA_FOR:
			current_width = (bitpacking_width_t)(*reinterpret_cast<T *>(current_group_ptr));
			current_group_ptr += MaxValue(sizeof(T), sizeof(bitpacking_width_t));
			break;
		case BitpackingMode::CONSTANT:
			break;
		default:
			throw InternalException("Invalid bitpacking mode");
		}

		// Read third value
		if (current_group.mode == BitpackingMode::DELTA_FOR) {
			current_delta_offset = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
		}
	}